

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O3

int __thiscall Fl_Tabs::push(Fl_Tabs *this,Fl_Widget *o)

{
  Fl_Widget *pFVar1;
  
  pFVar1 = this->push_;
  if (pFVar1 != o) {
    if (((pFVar1 != (Fl_Widget *)0x0) && ((pFVar1->flags_ & 2) != 0)) ||
       ((o != (Fl_Widget *)0x0 && ((o->flags_ & 2) != 0)))) {
      redraw_tabs(this);
    }
    this->push_ = o;
    return 1;
  }
  return 0;
}

Assistant:

int Fl_Tabs::push(Fl_Widget *o) {
  if (push_ == o) return 0;
  if ( (push_ && !push_->visible()) || (o && !o->visible()) )
    redraw_tabs();
  push_ = o;
  return 1;
}